

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfasttext.cc
# Opt level: O0

void cft_fasttext_get_word_vector(fasttext_t *handle,char *word,float *buf)

{
  real *__src;
  int64_t iVar1;
  void *in_RDX;
  char *in_RSI;
  Vector vec;
  int64_t in_stack_ffffffffffffff98;
  Vector *in_stack_ffffffffffffffa0;
  allocator local_51;
  string local_50 [16];
  string *in_stack_ffffffffffffffc0;
  Vector *in_stack_ffffffffffffffc8;
  FastText *in_stack_ffffffffffffffd0;
  
  fasttext::FastText::getDimension((FastText *)0x18fbdc);
  fasttext::Vector::Vector(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,in_RSI,&local_51);
  fasttext::FastText::getWordVector
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  __src = fasttext::Vector::data((Vector *)0x18fc69);
  iVar1 = fasttext::Vector::size((Vector *)0x18fc7a);
  memcpy(in_RDX,__src,iVar1 << 2);
  fasttext::Vector::~Vector((Vector *)0x18fca1);
  return;
}

Assistant:

void cft_fasttext_get_word_vector(fasttext_t* handle, const char* word, float* buf) {
    Vector vec(((FastText*)handle)->getDimension());
    ((FastText*)handle)->getWordVector(vec, word);
    memcpy(buf, vec.data(), vec.size() * sizeof(real));
}